

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::ensureTextPopulated(QLabelPrivate *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  QTextDocument *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  bool found;
  int from;
  QTextDocument *doc;
  QTextCursor cursor;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  byte in_stack_ffffffffffffff3e;
  byte in_stack_ffffffffffffff3f;
  QLatin1StringView *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  QTextDocument *in_stack_ffffffffffffff50;
  undefined4 local_7c;
  undefined1 local_3c [4];
  undefined1 local_38 [24];
  QTextCursor local_20 [8];
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(in_RDI + 0x340) >> 3 & 1) != 0) {
    if ((*(long *)(in_RDI + 0x2f8) != 0) &&
       (pQVar4 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff40),
       (*(ushort *)(in_RDI + 0x340) >> 3 & 1) != 0)) {
      if (*(int *)(in_RDI + 0x328) == 0) {
        QTextDocument::setPlainText((QString *)pQVar4);
      }
      else if (*(int *)(in_RDI + 0x328) == 1) {
        QTextDocument::setHtml((QString *)pQVar4);
      }
      else if (*(int *)(in_RDI + 0x328) == 3) {
        in_stack_ffffffffffffff50 = pQVar4;
        QFlags<QTextDocument::MarkdownFeature>::QFlags
                  ((QFlags<QTextDocument::MarkdownFeature> *)in_stack_ffffffffffffff40,
                   CONCAT13(in_stack_ffffffffffffff3f,
                            CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)));
        QTextDocument::setMarkdown
                  ((QString *)in_stack_ffffffffffffff50,(QFlags_conflict1 *)(in_RDI + 0x288));
      }
      else {
        QTextDocument::setPlainText((QString *)pQVar4);
      }
      QTextDocument::setUndoRedoEnabled(SUB81(pQVar4,0));
      if ((*(ushort *)(in_RDI + 0x340) >> 5 & 1) != 0) {
        local_7c = 0;
        bVar1 = false;
        local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor((QTextCursor *)local_18);
        while( true ) {
          in_stack_ffffffffffffff40 =
               (QLatin1StringView *)
               QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff40);
          latin1 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (size_t)in_stack_ffffffffffffff40);
          QString::QString((QString *)in_stack_ffffffffffffff50,latin1);
          memset(local_3c,0,4);
          QFlags<QTextDocument::FindFlag>::QFlags((QFlags<QTextDocument::FindFlag> *)0x5b0194);
          QTextDocument::find((QString *)local_20,(int)in_stack_ffffffffffffff40,
                              (QFlags_conflict1 *)local_38);
          QTextCursor::operator=
                    ((QTextCursor *)in_stack_ffffffffffffff40,
                     (QTextCursor *)
                     CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,
                                       CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                                      )));
          uVar2 = QTextCursor::isNull();
          in_stack_ffffffffffffff4c = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff4c) ^ 0xff000000;
          QTextCursor::~QTextCursor(local_20);
          QString::~QString((QString *)0x5b01f7);
          if ((in_stack_ffffffffffffff4c & 0x1000000) == 0) break;
          QTextCursor::deleteChar();
          QTextCursor::movePosition((MoveOperation)local_18,0x11,1);
          uVar3 = QTextCursor::position();
          in_stack_ffffffffffffff3e = 0;
          in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3e;
          in_stack_ffffffffffffff48 = local_7c;
          if (!bVar1) {
            QTextCursor::selectedText();
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_ffffffffffffff4c,local_7c),
                       (size_t)in_stack_ffffffffffffff40);
            in_stack_ffffffffffffff3e =
                 ::operator!=((QString *)CONCAT44(in_stack_ffffffffffffff4c,local_7c),
                              in_stack_ffffffffffffff40);
            in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3e;
            QString::~QString((QString *)0x5b02af);
            in_stack_ffffffffffffff48 = local_7c;
          }
          local_7c = uVar3;
          if ((in_stack_ffffffffffffff3e & 1) != 0) {
            bVar1 = true;
            QTextCursor::operator=((QTextCursor *)(in_RDI + 0x300),(QTextCursor *)local_18);
          }
        }
        QTextCursor::~QTextCursor((QTextCursor *)local_18);
      }
    }
    *(ushort *)(in_RDI + 0x340) = *(ushort *)(in_RDI + 0x340) & 0xfff7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextPopulated() const
{
    if (!textDirty)
        return;
    if (control) {
        QTextDocument *doc = control->document();
        if (textDirty) {
            if (effectiveTextFormat == Qt::PlainText) {
                doc->setPlainText(text);
#if QT_CONFIG(texthtmlparser)
            } else if (effectiveTextFormat == Qt::RichText) {
                doc->setHtml(text);
#endif
#if QT_CONFIG(textmarkdownreader)
            } else if (effectiveTextFormat == Qt::MarkdownText) {
                doc->setMarkdown(text);
#endif
            } else {
                doc->setPlainText(text);
            }
            doc->setUndoRedoEnabled(false);

#ifndef QT_NO_SHORTCUT
            if (hasShortcut) {
                // Underline the first character that follows an ampersand (and remove the others ampersands)
                int from = 0;
                bool found = false;
                QTextCursor cursor;
                while (!(cursor = control->document()->find(("&"_L1), from)).isNull()) {
                    cursor.deleteChar(); // remove the ampersand
                    cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
                    from = cursor.position();
                    if (!found && cursor.selectedText() != "&"_L1) { //not a second &
                        found = true;
                        shortcutCursor = cursor;
                    }
                }
            }
#endif
        }
    }
    textDirty = false;
}